

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtree.c
# Opt level: O3

rb_result_t rb_tree_find(rb_tree *tree,void *key,rb_tree_node **value)

{
  bool bVar1;
  int iVar2;
  rb_tree_node *node;
  rb_tree_node *unaff_RBX;
  rb_tree_node *prVar3;
  rb_tree *unaff_R14;
  rb_tree_node *prVar4;
  rb_result_t local_c;
  
  if (tree == (rb_tree *)0x0) {
    rb_tree_find_cold_3();
  }
  else if (value != (rb_tree_node **)0x0) {
    rb_tree_find_cold_1();
    return local_c;
  }
  rb_tree_find_cold_2();
  if (tree == (rb_tree *)0x0) {
    rb_tree_insert_cold_2();
  }
  else {
    unaff_RBX = node;
    if (node != (rb_tree_node *)0x0) {
      node->left = (rb_tree_node *)0x0;
      node->right = (rb_tree_node *)0x0;
      node->parent = (rb_tree_node *)0x0;
      node->key = key;
      prVar4 = tree->root;
      unaff_R14 = tree;
      if (prVar4 != (rb_tree_node *)0x0) {
        node->color = 1;
        iVar2 = (*tree->compare)(tree->state,key,prVar4->key);
        if (iVar2 == 0) {
          return 3;
        }
        bVar1 = true;
        do {
          if (iVar2 < 0) {
            prVar3 = prVar4->left;
            bVar1 = false;
            if (prVar3 == (rb_tree_node *)0x0) {
              prVar4->left = node;
              node->parent = prVar4;
              goto LAB_00113f29;
            }
          }
          else {
            prVar3 = prVar4->right;
            if (prVar3 == (rb_tree_node *)0x0) {
              prVar4->right = node;
              node->parent = prVar4;
              if (bVar1) {
                tree->rightmost = node;
              }
LAB_00113f29:
              __helper_rb_tree_insert_rebalance(tree,node);
              return 0;
            }
          }
          iVar2 = (*tree->compare)(tree->state,node->key,prVar3->key);
          prVar4 = prVar3;
          if (iVar2 == 0) {
            return 3;
          }
        } while( true );
      }
      goto LAB_00113f51;
    }
  }
  rb_tree_insert_cold_1();
LAB_00113f51:
  unaff_R14->root = unaff_RBX;
  unaff_R14->rightmost = unaff_RBX;
  unaff_RBX->color = 0;
  return 0;
}

Assistant:

rb_result_t rb_tree_find(struct rb_tree *tree,
                         const void *key,
                         struct rb_tree_node **value)
{
    rb_result_t ret = RB_OK;

    RB_ASSERT_ARG(tree != NULL);
    RB_ASSERT_ARG(value != NULL);

    *value = NULL;

    if (RB_UNLIKELY(tree->root == NULL)) {
        ret = RB_NOT_FOUND;
        goto done;
    }

    struct rb_tree_node *node = tree->root;

    while (node != NULL) {
        int compare = tree->compare(tree->state, key, node->key);

        if (compare < 0) {
            node = node->left;
        } else if (compare == 0) {
            break; /* We found our node */
        } else {
            /* Otherwise, we want the right node, and continue iteration */
            node = node->right;
        }
    }

    if (node == NULL) {
        ret = RB_NOT_FOUND;
        goto done;
    }

    /* Return the node we found */
    *value = node;

done:
    return ret;
}